

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_set_message_format(MESSAGE_HANDLE message,uint32_t message_format)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  uint32_t message_format_local;
  MESSAGE_HANDLE message_local;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_set_message_format",0x5b4,1,"NULL message");
    }
    l._0_4_ = 0x5b5;
  }
  else {
    message->message_format = message_format;
    l._0_4_ = 0;
  }
  return (int)l;
}

Assistant:

int message_set_message_format(MESSAGE_HANDLE message, uint32_t message_format)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_131: [ If `message` is NULL, `message_set_message_format` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MESSAGE_01_129: [ `message_set_message_format` shall set the message format for the message identified by `message`. ]*/
        message->message_format = message_format;

        /* Codes_SRS_MESSAGE_01_130: [ On success, `message_set_message_format` shall return 0. ]*/
        result = 0;
    }

    return result;
}